

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarProve(Abc_Ntk_t *pNtk,Fra_Sec_t *pSecPar,int nBmcFramesMax,int nBmcConfMax)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  char *pcVar6;
  Aig_Man_t *pAig;
  abctime aVar7;
  char *format;
  Abc_Ntk_t *pAVar8;
  Abc_Ntk_t **ppNtk;
  Aig_Man_t *pAVar9;
  Abc_Cex_t *__ptr;
  int iFrame;
  Abc_Ntk_t *pNtkComb;
  Prove_Params_t Params;
  
  iFrame = -1;
  pAVar8 = pNtk;
  aVar5 = Abc_Clock();
  if (pSecPar->fTryComb == 0) {
    if (pNtk->nObjCounts[8] != 0) goto LAB_002729e8;
LAB_00272950:
    Abc_Print((int)pAVar8,"The network has no latches. Running CEC.\n");
  }
  else if (pNtk->nObjCounts[8] == 0) goto LAB_00272950;
  pNtkComb = Abc_NtkDup(pNtk);
  ppNtk = &pNtkComb;
  Abc_NtkMakeComb(pNtkComb,1);
  Prove_ParamsSetDefault(&Params);
  Params.fVerbose = 1;
  iVar3 = Abc_NtkIvyProve(ppNtk,&Params);
  iVar4 = (int)ppNtk;
  if ((iVar3 == 0) && (pNtk->nObjCounts[8] == 0)) {
    pNtk->pModel = pNtkComb->pModel;
    pNtkComb->pModel = (int *)0x0;
    iVar1 = pSecPar->fReportSolution;
    pcVar6 = "SATISFIABLE    ";
    format = "SOLUTION: FAIL       ";
  }
  else {
    pAVar8 = pNtkComb;
    Abc_NtkDelete(pNtkComb);
    iVar4 = (int)pAVar8;
    if (iVar3 != 1) {
      if (pNtk->nObjCounts[8] != 0) {
LAB_002729e8:
        pAVar8 = pNtk;
        pAig = Abc_NtkToDar(pNtk,0,1);
        if (pAig == (Aig_Man_t *)0x0) {
          Abc_Print((int)pAVar8,"Converting miter into AIG has failed.\n");
          return -1;
        }
        if (0 < pAig->nRegs) {
          if (pSecPar->fTryBmc != 0) {
            pAVar9 = pAig;
            iVar3 = Saig_BmcPerform(pAig,0,nBmcFramesMax,2000,0,nBmcConfMax,0,pSecPar->fVerbose,0,
                                    &iFrame,0,0);
            iVar4 = (int)pAVar9;
            if (iVar3 == 0) {
              Abc_Print(iVar4,"Networks are not equivalent.\n");
              if (pSecPar->fReportSolution != 0) {
                Abc_Print(iVar4,"SOLUTION: FAIL       ");
                Abc_Print(iVar4,"%s =","Time");
                aVar7 = Abc_Clock();
                Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
              }
              if (pNtk->pModel != (int *)0x0) {
                free(pNtk->pModel);
                pNtk->pModel = (int *)0x0;
              }
              free(pNtk->pSeqModel);
              pNtk->pSeqModel = pAig->pSeqModel;
              pAig->pSeqModel = (Abc_Cex_t *)0x0;
              Aig_ManStop(pAig);
              return 0;
            }
          }
          if (pSecPar->fUseNewProver == 0) {
            iVar3 = Fra_FraigSec(pAig,pSecPar,(Aig_Man_t **)0x0);
            if (pNtk->pModel != (int *)0x0) {
              free(pNtk->pModel);
              pNtk->pModel = (int *)0x0;
            }
            __ptr = pNtk->pSeqModel;
            free(__ptr);
            pAVar2 = pAig->pSeqModel;
            pNtk->pSeqModel = pAVar2;
            pAig->pSeqModel = (Abc_Cex_t *)0x0;
            if (pAVar2 != (Abc_Cex_t *)0x0) {
              Abc_Print((int)__ptr,"Output %d of miter \"%s\" was asserted in frame %d.\n",
                        (ulong)(uint)pAVar2->iPo,pNtk->pName,(ulong)(uint)pAVar2->iFrame);
              pAVar9 = pAig;
              iVar4 = Saig_ManVerifyCex(pAig,pNtk->pSeqModel);
              if (iVar4 == 0) {
                Abc_Print((int)pAVar9,
                          "Abc_NtkDarProve(): Counter-example verification has FAILED.\n");
              }
            }
          }
          else {
            iVar3 = Ssw_SecGeneralMiter(pAig,(Ssw_Pars_t *)0x0);
          }
          Aig_ManStop(pAig);
          return iVar3;
        }
        __assert_fail("pMan->nRegs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                      ,0xb4b,"int Abc_NtkDarProve(Abc_Ntk_t *, Fra_Sec_t *, int, int)");
      }
      format = "UNDECIDED      ";
      goto LAB_00272acd;
    }
    iVar1 = pSecPar->fReportSolution;
    pcVar6 = "UNSATISFIABLE  ";
    format = "SOLUTION: PASS       ";
  }
  if (iVar1 == 0) {
    format = pcVar6;
  }
LAB_00272acd:
  Abc_Print(iVar4,format);
  Abc_Print(iVar4,"%s =","Time");
  aVar7 = Abc_Clock();
  Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
  return iVar3;
}

Assistant:

int Abc_NtkDarProve( Abc_Ntk_t * pNtk, Fra_Sec_t * pSecPar, int nBmcFramesMax, int nBmcConfMax )
{
    Aig_Man_t * pMan;
    int iFrame = -1, RetValue = -1;
    abctime clkTotal = Abc_Clock();
    if ( pSecPar->fTryComb || Abc_NtkLatchNum(pNtk) == 0 )
    {
        Prove_Params_t Params, * pParams = &Params;
        Abc_Ntk_t * pNtkComb;
        int RetValue;
        if ( Abc_NtkLatchNum(pNtk) == 0 )
            Abc_Print( 1, "The network has no latches. Running CEC.\n" );
        // create combinational network
        pNtkComb = Abc_NtkDup( pNtk );
        Abc_NtkMakeComb( pNtkComb, 1 );
        // solve it using combinational equivalence checking
        Prove_ParamsSetDefault( pParams );
        pParams->fVerbose = 1;
        RetValue = Abc_NtkIvyProve( &pNtkComb, pParams );
        // transfer model if given
//        pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
        if ( RetValue == 0  && (Abc_NtkLatchNum(pNtk) == 0) )
        {
            pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
            if ( pSecPar->fReportSolution )
                Abc_Print( 1, "SOLUTION: FAIL       " );
            else
                Abc_Print( 1, "SATISFIABLE    " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
        Abc_NtkDelete( pNtkComb );
        // return the result, if solved
        if ( RetValue == 1 )
        {
            if ( pSecPar->fReportSolution )
                Abc_Print( 1, "SOLUTION: PASS       " );
            else
                Abc_Print( 1, "UNSATISFIABLE  " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
        // return undecided, if the miter is combinational
        if ( Abc_NtkLatchNum(pNtk) == 0 )
        {
            Abc_Print( 1, "UNDECIDED      " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            return RetValue;
        }
    }
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( pMan->nRegs > 0 );

    if ( pSecPar->fTryBmc )
    {
        RetValue = Saig_BmcPerform( pMan, 0, nBmcFramesMax, 2000, 0, nBmcConfMax, 0, pSecPar->fVerbose, 0, &iFrame, 0, 0 );
        if ( RetValue == 0 )
        {
            Abc_Print( 1, "Networks are not equivalent.\n" );
            if ( pSecPar->fReportSolution )
            {
                Abc_Print( 1, "SOLUTION: FAIL       " );
                ABC_PRT( "Time", Abc_Clock() - clkTotal );
            }
            // return the counter-example generated
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
            Aig_ManStop( pMan );
            return RetValue;
        }
    } 
    // perform verification
    if ( pSecPar->fUseNewProver )
    {
        RetValue = Ssw_SecGeneralMiter( pMan, NULL );
    }
    else
    {
        RetValue = Fra_FraigSec( pMan, pSecPar, NULL );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( pNtk->pSeqModel )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", pCex->iPo, pNtk->pName, pCex->iFrame );
            if ( !Saig_ManVerifyCex( pMan, pNtk->pSeqModel ) )
                Abc_Print( 1, "Abc_NtkDarProve(): Counter-example verification has FAILED.\n" );
        }
    }
    Aig_ManStop( pMan );
    return RetValue;
}